

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectShadow.cpp
# Opt level: O2

SharedPtr<FontEffect> __thiscall
Rml::FontEffectShadowInstancer::InstanceFontEffect
          (FontEffectShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  int iVar3;
  Colour<unsigned_char,_255,_false> _colour;
  Property *pPVar4;
  PropertyDictionary *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar5;
  SharedPtr<Rml::FontEffectShadow> font_effect;
  FontEffect *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  iVar2 = Property::Get<int>(pPVar4);
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  iVar3 = Property::Get<int>(pPVar4);
  pPVar4 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  _colour = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar4);
  ::std::make_shared<Rml::FontEffectShadow>();
  local_38[1]._vptr_FontEffect = (_func_int **)CONCAT44(iVar3,iVar2);
  FontEffect::SetColour(local_38,_colour);
  _Var1._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_38;
  (this->super_FontEffectInstancer).properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedPtr<FontEffect>)
         SVar5.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectShadowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectShadow>();
	if (font_effect->Initialise(offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}